

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O0

REF_STATUS
ref_part_meshb_geom_delete_me
          (REF_GEOM ref_geom,REF_INT ngeom,REF_INT type,REF_NODE ref_node,REF_INT nnode,FILE *file)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  int local_178;
  int local_168;
  int local_164;
  int local_160;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_INT local_d0;
  REF_INT new_location;
  REF_INT node;
  REF_INT part;
  REF_INT new_geom;
  REF_INT i;
  REF_INT geom;
  REF_INT geom_to_receive;
  REF_INT *start_to_send;
  REF_INT *geom_to_send;
  REF_INT *dest;
  int local_98;
  REF_INT section_size;
  REF_INT ngeom_keep;
  REF_INT ngeom_read;
  double double_gref;
  REF_DBL *read_param;
  REF_INT *read_gref;
  REF_INT *read_id;
  REF_INT *read_node;
  REF_DBL *sent_param;
  REF_INT *sent_gref;
  REF_INT *sent_id;
  REF_INT *sent_node;
  REF_INT chunk;
  REF_INT end_of_message;
  REF_MPI ref_mpi;
  FILE *file_local;
  REF_NODE pRStack_28;
  REF_INT nnode_local;
  REF_NODE ref_node_local;
  REF_INT type_local;
  REF_INT ngeom_local;
  REF_GEOM ref_geom_local;
  
  _chunk = ref_node->ref_mpi;
  sent_node._4_4_ = -1;
  if (ngeom / _chunk->n < 1000000) {
    local_160 = 1000000;
  }
  else {
    local_160 = ngeom / _chunk->n;
  }
  local_164 = ngeom;
  if (local_160 < ngeom) {
    local_164 = local_160;
  }
  sent_node._0_4_ = local_164;
  ref_mpi = (REF_MPI)file;
  file_local._4_4_ = nnode;
  pRStack_28 = ref_node;
  ref_node_local._0_4_ = type;
  ref_node_local._4_4_ = ngeom;
  _type_local = ref_geom;
  if (local_164 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xbc,
           "ref_part_meshb_geom_delete_me","malloc sent_node of REF_INT negative");
    ref_geom_local._4_4_ = 1;
  }
  else {
    sent_id = (REF_INT *)malloc((long)local_164 << 2);
    if (sent_id == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xbc,
             "ref_part_meshb_geom_delete_me","malloc sent_node of REF_INT NULL");
      ref_geom_local._4_4_ = 2;
    }
    else if ((int)sent_node < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xbd,
             "ref_part_meshb_geom_delete_me","malloc sent_id of REF_INT negative");
      ref_geom_local._4_4_ = 1;
    }
    else {
      sent_gref = (REF_INT *)malloc((long)(int)sent_node << 2);
      if (sent_gref == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xbd
               ,"ref_part_meshb_geom_delete_me","malloc sent_id of REF_INT NULL");
        ref_geom_local._4_4_ = 2;
      }
      else if ((int)sent_node < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xbe
               ,"ref_part_meshb_geom_delete_me","malloc sent_gref of REF_INT negative");
        ref_geom_local._4_4_ = 1;
      }
      else {
        sent_param = (REF_DBL *)malloc((long)(int)sent_node << 2);
        if (sent_param == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0xbe,"ref_part_meshb_geom_delete_me","malloc sent_gref of REF_INT NULL");
          ref_geom_local._4_4_ = 2;
        }
        else if ((int)sent_node * 2 < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0xbf,"ref_part_meshb_geom_delete_me","malloc sent_param of REF_DBL negative");
          ref_geom_local._4_4_ = 1;
        }
        else {
          read_node = (REF_INT *)malloc((long)((int)sent_node << 1) << 3);
          if (read_node == (REF_INT *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0xbf,"ref_part_meshb_geom_delete_me","malloc sent_param of REF_DBL NULL");
            ref_geom_local._4_4_ = 2;
          }
          else {
            if (_chunk->id == 0) {
              if (_chunk->n < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0xc2,"ref_part_meshb_geom_delete_me",
                       "malloc geom_to_send of REF_INT negative");
                return 1;
              }
              start_to_send = (REF_INT *)malloc((long)_chunk->n << 2);
              if (start_to_send == (REF_INT *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0xc2,"ref_part_meshb_geom_delete_me","malloc geom_to_send of REF_INT NULL");
                return 2;
              }
              if (_chunk->n < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0xc3,"ref_part_meshb_geom_delete_me",
                       "malloc start_to_send of REF_INT negative");
                return 1;
              }
              _geom = (undefined4 *)malloc((long)_chunk->n << 2);
              if (_geom == (undefined4 *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0xc3,"ref_part_meshb_geom_delete_me","malloc start_to_send of REF_INT NULL")
                ;
                return 2;
              }
              if ((int)sent_node < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0xc4,"ref_part_meshb_geom_delete_me","malloc read_node of REF_INT negative")
                ;
                return 1;
              }
              read_id = (REF_INT *)malloc((long)(int)sent_node << 2);
              if (read_id == (REF_INT *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0xc4,"ref_part_meshb_geom_delete_me","malloc read_node of REF_INT NULL");
                return 2;
              }
              if ((int)sent_node < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0xc5,"ref_part_meshb_geom_delete_me","malloc read_id of REF_INT negative");
                return 1;
              }
              read_gref = (REF_INT *)malloc((long)(int)sent_node << 2);
              if (read_gref == (REF_INT *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0xc5,"ref_part_meshb_geom_delete_me","malloc read_id of REF_INT NULL");
                return 2;
              }
              if ((int)sent_node < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0xc6,"ref_part_meshb_geom_delete_me","malloc read_gref of REF_INT negative")
                ;
                return 1;
              }
              read_param = (REF_DBL *)malloc((long)(int)sent_node << 2);
              if (read_param == (REF_DBL *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0xc6,"ref_part_meshb_geom_delete_me","malloc read_gref of REF_INT NULL");
                return 2;
              }
              if ((int)sent_node * 2 < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,199,"ref_part_meshb_geom_delete_me","malloc read_param of REF_DBL negative")
                ;
                return 1;
              }
              double_gref = (double)malloc((long)((int)sent_node << 1) << 3);
              if ((void *)double_gref == (void *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,199,"ref_part_meshb_geom_delete_me","malloc read_param of REF_DBL NULL");
                return 2;
              }
              if ((int)sent_node < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,200,"ref_part_meshb_geom_delete_me","malloc dest of REF_INT negative");
                return 1;
              }
              geom_to_send = (REF_INT *)malloc((long)(int)sent_node << 2);
              if (geom_to_send == (REF_INT *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,200,"ref_part_meshb_geom_delete_me","malloc dest of REF_INT NULL");
                return 2;
              }
              section_size = 0;
              while (section_size < ref_node_local._4_4_) {
                if ((int)sent_node < ref_node_local._4_4_ - section_size) {
                  local_168 = (int)sent_node;
                }
                else {
                  local_168 = ref_node_local._4_4_ - section_size;
                }
                dest._4_4_ = local_168;
                for (new_geom = 0; new_geom < dest._4_4_; new_geom = new_geom + 1) {
                  sVar3 = fread(read_id + new_geom,4,1,(FILE *)ref_mpi);
                  if (sVar3 != 1) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0xce,"ref_part_meshb_geom_delete_me","n",1,sVar3);
                    return 1;
                  }
                  sVar3 = fread(read_gref + new_geom,4,1,(FILE *)ref_mpi);
                  if (sVar3 != 1) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0xcf,"ref_part_meshb_geom_delete_me","n",1,sVar3);
                    return 1;
                  }
                  for (part = 0; part < 2; part = part + 1) {
                    *(undefined8 *)((long)double_gref + (long)(part + new_geom * 2) * 8) = 0;
                  }
                  for (part = 0; part < (REF_INT)ref_node_local; part = part + 1) {
                    sVar3 = fread((void *)((long)double_gref + (long)(part + new_geom * 2) * 8),8,1,
                                  (FILE *)ref_mpi);
                    if (sVar3 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0xd4,"ref_part_meshb_geom_delete_me","param",1,sVar3);
                      return 1;
                    }
                  }
                  *(REF_INT *)((long)read_param + (long)new_geom * 4) = read_gref[new_geom];
                  if (0 < (REF_INT)ref_node_local) {
                    sVar3 = fread(&ngeom_keep,8,1,(FILE *)ref_mpi);
                    if (sVar3 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0xd7,"ref_part_meshb_geom_delete_me","gref",1,sVar3);
                      return 1;
                    }
                    *(int *)((long)read_param + (long)new_geom * 4) = (int)_ngeom_keep;
                  }
                }
                for (new_geom = 0; new_geom < dest._4_4_; new_geom = new_geom + 1) {
                  read_id[new_geom] = read_id[new_geom] + -1;
                }
                section_size = dest._4_4_ + section_size;
                for (new_geom = 0; new_geom < dest._4_4_; new_geom = new_geom + 1) {
                  if (read_id[new_geom] / ((file_local._4_4_ + _chunk->n + -1) / _chunk->n) <
                      file_local._4_4_ - _chunk->n * ((file_local._4_4_ + -1) / _chunk->n)) {
                    local_178 = read_id[new_geom] /
                                ((file_local._4_4_ + _chunk->n + -1) / _chunk->n);
                  }
                  else {
                    local_178 = (read_id[new_geom] -
                                (file_local._4_4_ -
                                _chunk->n * ((file_local._4_4_ + -1) / _chunk->n)) *
                                ((file_local._4_4_ + _chunk->n + -1) / _chunk->n)) /
                                ((file_local._4_4_ + -1) / _chunk->n) +
                                (file_local._4_4_ -
                                _chunk->n * ((file_local._4_4_ + -1) / _chunk->n));
                  }
                  geom_to_send[new_geom] = local_178;
                }
                for (new_location = 0; new_location < _chunk->n; new_location = new_location + 1) {
                  start_to_send[new_location] = 0;
                }
                for (new_geom = 0; new_geom < dest._4_4_; new_geom = new_geom + 1) {
                  start_to_send[geom_to_send[new_geom]] = start_to_send[geom_to_send[new_geom]] + 1;
                }
                *_geom = 0;
                for (new_location = 1; new_location < _chunk->n; new_location = new_location + 1) {
                  _geom[new_location] = _geom[new_location + -1] + start_to_send[new_location + -1];
                }
                for (new_location = 0; new_location < _chunk->n; new_location = new_location + 1) {
                  start_to_send[new_location] = 0;
                }
                for (new_geom = 0; new_geom < dest._4_4_; new_geom = new_geom + 1) {
                  iVar1 = _geom[geom_to_send[new_geom]] + start_to_send[geom_to_send[new_geom]];
                  sent_id[iVar1] = read_id[new_geom];
                  sent_gref[iVar1] = read_gref[new_geom];
                  *(undefined4 *)((long)sent_param + (long)iVar1 * 4) =
                       *(undefined4 *)((long)read_param + (long)new_geom * 4);
                  *(undefined8 *)(read_node + (long)(iVar1 * 2) * 2) =
                       *(undefined8 *)((long)double_gref + (long)(new_geom << 1) * 8);
                  *(undefined8 *)(read_node + (long)(iVar1 * 2 + 1) * 2) =
                       *(undefined8 *)((long)double_gref + (long)(new_geom * 2 + 1) * 8);
                  start_to_send[geom_to_send[new_geom]] = start_to_send[geom_to_send[new_geom]] + 1;
                }
                local_98 = *start_to_send;
                for (new_geom = 0; new_geom < local_98; new_geom = new_geom + 1) {
                  uVar2 = ::ref_node_local(pRStack_28,(long)sent_id[new_geom],&local_d0);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0xf9,"ref_part_meshb_geom_delete_me",(ulong)uVar2,"g2l");
                    return uVar2;
                  }
                  uVar2 = ref_geom_add(_type_local,local_d0,(REF_INT)ref_node_local,
                                       sent_gref[new_geom],
                                       (REF_DBL *)(read_node + (long)(new_geom << 1) * 2));
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0xfc,"ref_part_meshb_geom_delete_me",(ulong)uVar2,"add geom");
                    return uVar2;
                  }
                  uVar2 = ref_geom_find(_type_local,local_d0,(REF_INT)ref_node_local,
                                        sent_gref[new_geom],&node);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0xfe,"ref_part_meshb_geom_delete_me",(ulong)uVar2,"find");
                    return uVar2;
                  }
                  _type_local->descr[node * 6 + 2] =
                       *(REF_INT *)((long)sent_param + (long)new_geom * 4);
                }
                for (new_location = 1; new_location < _chunk->n; new_location = new_location + 1) {
                  if (0 < start_to_send[new_location]) {
                    uVar2 = ref_mpi_scatter_send
                                      (_chunk,start_to_send + new_location,1,1,new_location);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x107,"ref_part_meshb_geom_delete_me",(ulong)uVar2,"send");
                      return uVar2;
                    }
                    uVar2 = ref_mpi_scatter_send
                                      (_chunk,sent_id + (int)_geom[new_location],
                                       start_to_send[new_location],1,new_location);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x10a,"ref_part_meshb_geom_delete_me",(ulong)uVar2,"send");
                      return uVar2;
                    }
                    uVar2 = ref_mpi_scatter_send
                                      (_chunk,sent_gref + (int)_geom[new_location],
                                       start_to_send[new_location],1,new_location);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x10d,"ref_part_meshb_geom_delete_me",(ulong)uVar2,"send");
                      return uVar2;
                    }
                    uVar2 = ref_mpi_scatter_send
                                      (_chunk,(void *)((long)sent_param +
                                                      (long)(int)_geom[new_location] * 4),
                                       start_to_send[new_location],1,new_location);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x110,"ref_part_meshb_geom_delete_me",(ulong)uVar2,"send");
                      return uVar2;
                    }
                    uVar2 = ref_mpi_scatter_send
                                      (_chunk,read_node + (long)(int)(_geom[new_location] << 1) * 2,
                                       start_to_send[new_location] << 1,3,new_location);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x114,"ref_part_meshb_geom_delete_me",(ulong)uVar2,"send");
                      return uVar2;
                    }
                  }
                }
              }
              if (geom_to_send != (REF_INT *)0x0) {
                free(geom_to_send);
              }
              if (double_gref != 0.0) {
                free((void *)double_gref);
              }
              if (read_param != (REF_DBL *)0x0) {
                free(read_param);
              }
              if (read_gref != (REF_INT *)0x0) {
                free(read_gref);
              }
              if (read_id != (REF_INT *)0x0) {
                free(read_id);
              }
              if (_geom != (undefined4 *)0x0) {
                free(_geom);
              }
              if (start_to_send != (REF_INT *)0x0) {
                free(start_to_send);
              }
              for (new_location = 1; new_location < _chunk->n; new_location = new_location + 1) {
                uVar2 = ref_mpi_scatter_send(_chunk,(void *)((long)&sent_node + 4),1,1,new_location)
                ;
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x124,"ref_part_meshb_geom_delete_me",(ulong)uVar2,"send");
                  return uVar2;
                }
              }
            }
            else {
              do {
                uVar2 = ref_mpi_scatter_recv(_chunk,&i,1,1);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x129,"ref_part_meshb_geom_delete_me",(ulong)uVar2,"recv");
                  return uVar2;
                }
                if (0 < i) {
                  uVar2 = ref_mpi_scatter_recv(_chunk,sent_id,i,1);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x12d,"ref_part_meshb_geom_delete_me",(ulong)uVar2,"send");
                    return uVar2;
                  }
                  uVar2 = ref_mpi_scatter_recv(_chunk,sent_gref,i,1);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x130,"ref_part_meshb_geom_delete_me",(ulong)uVar2,"send");
                    return uVar2;
                  }
                  uVar2 = ref_mpi_scatter_recv(_chunk,sent_param,i,1);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x133,"ref_part_meshb_geom_delete_me",(ulong)uVar2,"send");
                    return uVar2;
                  }
                  uVar2 = ref_mpi_scatter_recv(_chunk,read_node,i << 1,3);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x136,"ref_part_meshb_geom_delete_me",(ulong)uVar2,"send");
                    return uVar2;
                  }
                  for (new_geom = 0; new_geom < i; new_geom = new_geom + 1) {
                    uVar2 = ::ref_node_local(pRStack_28,(long)sent_id[new_geom],&local_d0);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x138,"ref_part_meshb_geom_delete_me",(ulong)uVar2,"g2l");
                      return uVar2;
                    }
                    uVar2 = ref_geom_add(_type_local,local_d0,(REF_INT)ref_node_local,
                                         sent_gref[new_geom],
                                         (REF_DBL *)(read_node + (long)(new_geom << 1) * 2));
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x13b,"ref_part_meshb_geom_delete_me",(ulong)uVar2,"add geom");
                      return uVar2;
                    }
                    uVar2 = ref_geom_find(_type_local,local_d0,(REF_INT)ref_node_local,
                                          sent_gref[new_geom],&node);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x13d,"ref_part_meshb_geom_delete_me",(ulong)uVar2,"find");
                      return uVar2;
                    }
                    _type_local->descr[node * 6 + 2] =
                         *(REF_INT *)((long)sent_param + (long)new_geom * 4);
                  }
                }
              } while (i != sent_node._4_4_);
            }
            free(read_node);
            free(sent_param);
            free(sent_gref);
            free(sent_id);
            ref_geom_local._4_4_ = 0;
          }
        }
      }
    }
  }
  return ref_geom_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_part_meshb_geom_delete_me(REF_GEOM ref_geom,
                                                 REF_INT ngeom, REF_INT type,
                                                 REF_NODE ref_node,
                                                 REF_INT nnode, FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT end_of_message = REF_EMPTY;
  REF_INT chunk;
  REF_INT *sent_node;
  REF_INT *sent_id;
  REF_INT *sent_gref;
  REF_DBL *sent_param;
  REF_INT *read_node;
  REF_INT *read_id;
  REF_INT *read_gref;
  REF_DBL *read_param;
  double double_gref;

  REF_INT ngeom_read, ngeom_keep;
  REF_INT section_size;

  REF_INT *dest;
  REF_INT *geom_to_send;
  REF_INT *start_to_send;

  REF_INT geom_to_receive;

  REF_INT geom, i, new_geom;
  REF_INT part, node;
  REF_INT new_location;

  chunk = MAX(1000000, ngeom / ref_mpi_n(ref_mpi));
  chunk = MIN(chunk, ngeom);

  ref_malloc(sent_node, chunk, REF_INT);
  ref_malloc(sent_id, chunk, REF_INT);
  ref_malloc(sent_gref, chunk, REF_INT);
  ref_malloc(sent_param, 2 * chunk, REF_DBL);

  if (ref_mpi_once(ref_mpi)) {
    ref_malloc(geom_to_send, ref_mpi_n(ref_mpi), REF_INT);
    ref_malloc(start_to_send, ref_mpi_n(ref_mpi), REF_INT);
    ref_malloc(read_node, chunk, REF_INT);
    ref_malloc(read_id, chunk, REF_INT);
    ref_malloc(read_gref, chunk, REF_INT);
    ref_malloc(read_param, 2 * chunk, REF_DBL);
    ref_malloc(dest, chunk, REF_INT);

    ngeom_read = 0;
    while (ngeom_read < ngeom) {
      section_size = MIN(chunk, ngeom - ngeom_read);
      for (geom = 0; geom < section_size; geom++) {
        REIS(1, fread(&(read_node[geom]), sizeof(REF_INT), 1, file), "n");
        REIS(1, fread(&(read_id[geom]), sizeof(REF_INT), 1, file), "n");
        for (i = 0; i < 2; i++)
          read_param[i + 2 * geom] = 0.0; /* ensure init */
        for (i = 0; i < type; i++)
          REIS(1, fread(&(read_param[i + 2 * geom]), sizeof(double), 1, file),
               "param");
        read_gref[geom] = read_id[geom];
        if (0 < type) {
          REIS(1, fread(&(double_gref), sizeof(double), 1, file), "gref");
          read_gref[geom] = (REF_INT)double_gref;
        }
      }
      for (geom = 0; geom < section_size; geom++) read_node[geom]--;

      ngeom_read += section_size;

      for (geom = 0; geom < section_size; geom++)
        dest[geom] =
            ref_part_implicit(nnode, ref_mpi_n(ref_mpi), read_node[geom]);

      each_ref_mpi_part(ref_mpi, part) geom_to_send[part] = 0;
      for (geom = 0; geom < section_size; geom++) geom_to_send[dest[geom]]++;

      start_to_send[0] = 0;
      each_ref_mpi_worker(ref_mpi, part) {
        start_to_send[part] = start_to_send[part - 1] + geom_to_send[part - 1];
      }

      each_ref_mpi_part(ref_mpi, part) geom_to_send[part] = 0;
      for (geom = 0; geom < section_size; geom++) {
        new_location = start_to_send[dest[geom]] + geom_to_send[dest[geom]];
        sent_node[new_location] = read_node[geom];
        sent_id[new_location] = read_id[geom];
        sent_gref[new_location] = read_gref[geom];
        sent_param[0 + 2 * new_location] = read_param[0 + 2 * geom];
        sent_param[1 + 2 * new_location] = read_param[1 + 2 * geom];
        geom_to_send[dest[geom]]++;
      }

      /* rank 0 keepers */
      ngeom_keep = geom_to_send[0];
      for (geom = 0; geom < ngeom_keep; geom++) {
        RSS(ref_node_local(ref_node, sent_node[geom], &node), "g2l");
        RSS(ref_geom_add(ref_geom, node, type, sent_id[geom],
                         &(sent_param[2 * geom])),
            "add geom");
        RSS(ref_geom_find(ref_geom, node, type, sent_id[geom], &new_geom),
            "find");
        ref_geom_gref(ref_geom, new_geom) = sent_gref[geom];
      }

      /* ship it! */
      each_ref_mpi_worker(ref_mpi, part) {
        if (0 < geom_to_send[part]) {
          RSS(ref_mpi_scatter_send(ref_mpi, &(geom_to_send[part]), 1,
                                   REF_INT_TYPE, part),
              "send");
          RSS(ref_mpi_scatter_send(ref_mpi, &(sent_node[start_to_send[part]]),
                                   geom_to_send[part], REF_INT_TYPE, part),
              "send");
          RSS(ref_mpi_scatter_send(ref_mpi, &(sent_id[start_to_send[part]]),
                                   geom_to_send[part], REF_INT_TYPE, part),
              "send");
          RSS(ref_mpi_scatter_send(ref_mpi, &(sent_gref[start_to_send[part]]),
                                   geom_to_send[part], REF_INT_TYPE, part),
              "send");
          RSS(ref_mpi_scatter_send(ref_mpi,
                                   &(sent_param[2 * start_to_send[part]]),
                                   2 * geom_to_send[part], REF_DBL_TYPE, part),
              "send");
        }
      }
    }

    ref_free(dest);
    ref_free(read_param);
    ref_free(read_gref);
    ref_free(read_id);
    ref_free(read_node);
    ref_free(start_to_send);
    ref_free(geom_to_send);

    /* signal we are done */
    each_ref_mpi_worker(ref_mpi, part) {
      RSS(ref_mpi_scatter_send(ref_mpi, &end_of_message, 1, REF_INT_TYPE, part),
          "send");
    }
  } else {
    do {
      RSS(ref_mpi_scatter_recv(ref_mpi, &geom_to_receive, 1, REF_INT_TYPE),
          "recv");
      if (geom_to_receive > 0) {
        RSS(ref_mpi_scatter_recv(ref_mpi, sent_node, geom_to_receive,
                                 REF_INT_TYPE),
            "send");
        RSS(ref_mpi_scatter_recv(ref_mpi, sent_id, geom_to_receive,
                                 REF_INT_TYPE),
            "send");
        RSS(ref_mpi_scatter_recv(ref_mpi, sent_gref, geom_to_receive,
                                 REF_INT_TYPE),
            "send");
        RSS(ref_mpi_scatter_recv(ref_mpi, sent_param, 2 * geom_to_receive,
                                 REF_DBL_TYPE),
            "send");
        for (geom = 0; geom < geom_to_receive; geom++) {
          RSS(ref_node_local(ref_node, sent_node[geom], &node), "g2l");
          RSS(ref_geom_add(ref_geom, node, type, sent_id[geom],
                           &(sent_param[2 * geom])),
              "add geom");
          RSS(ref_geom_find(ref_geom, node, type, sent_id[geom], &new_geom),
              "find");
          ref_geom_gref(ref_geom, new_geom) = sent_gref[geom];
        }
      }
    } while (geom_to_receive != end_of_message);
  }

  free(sent_param);
  free(sent_gref);
  free(sent_id);
  free(sent_node);

  return REF_SUCCESS;
}